

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleCaseBase::testRender(TriangleCaseBase *this)

{
  int *value;
  int *value_00;
  int *value_01;
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  TextureFormat log;
  pointer pTVar2;
  Context *pCVar3;
  Surface *pSVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  RenderTarget *pRVar8;
  RenderTarget *pRVar9;
  MessageBuilder *pMVar10;
  long lVar11;
  Vec4 *p;
  Vec4 *p_00;
  Vec4 *p_01;
  Vec4 *p_02;
  Vec4 *p_03;
  int samples;
  ulong uVar12;
  long lVar13;
  int contextNdx;
  string v0Properties;
  Surface *surfaces [2];
  Context *contexts [2];
  Surface refSurface;
  Surface testSurface;
  string c2Properties;
  string c1Properties;
  string c0Properties;
  string v2Properties;
  string v1Properties;
  undefined1 local_6700 [384];
  ReferenceContextBuffers buffers;
  ReferenceContextLimits local_6508;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  samples = 1;
  if (1 < pRVar8->m_numSamples) {
    samples = pRVar8->m_numSamples;
  }
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  refContext.super_Context._vptr_Context = (_func_int **)0x0;
  refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  refContext.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&glesContext,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&refContext);
  local_6508.extensionStr._M_dataplus._M_p = (pointer)&local_6508.extensionStr.field_2;
  local_6508.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6508.maxTextureImageUnits = 0x10;
  local_6508.maxTexture2DSize = 0x800;
  local_6508.maxTextureCubeSize = 0x800;
  local_6508.maxTexture2DArrayLayers = 0x100;
  local_6508.maxTexture3DSize = 0x100;
  local_6508.maxRenderbufferSize = 0x800;
  local_6508.maxVertexAttribs = 0x10;
  local_6508.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6508.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6508.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6508.extensionStr._M_string_length = 0;
  local_6508.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar9 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,&pRVar8->m_pixelFormat,pRVar9->m_depthBits,0,200,200,samples);
  sglr::ReferenceContextBuffers::getColorbuffer((MultisamplePixelBufferAccess *)local_6700,&buffers)
  ;
  sglr::ReferenceContextBuffers::getDepthbuffer((MultisamplePixelBufferAccess *)&program,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&v0Properties,&buffers);
  sglr::ReferenceContext::ReferenceContext
            (&refContext,&local_6508,(MultisamplePixelBufferAccess *)local_6700,
             (MultisamplePixelBufferAccess *)&program,(MultisamplePixelBufferAccess *)&v0Properties)
  ;
  PositionColorShader::PositionColorShader(&program);
  tcu::Surface::Surface(&testSurface,200,200);
  tcu::Surface::Surface(&refSurface,200,200);
  poVar1 = (ostringstream *)(local_6700 + 8);
  surfaces[0] = &testSurface;
  surfaces[1] = &refSurface;
  contexts[0] = &glesContext.super_Context;
  contexts[1] = &refContext.super_Context;
  local_6700._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Viewport: left=");
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_6700,&(this->m_viewport).left);
  std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tbottom=");
  value = &(this->m_viewport).bottom;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value);
  std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\twidth=");
  value_00 = &(this->m_viewport).width;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value_00);
  std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\theight=");
  value_01 = &(this->m_viewport).height;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value_01);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_6700 + 8);
  local_6700._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering triangles. Coordinates:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6700,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_6700 + 8);
  this_00 = (ostringstream *)(local_6700 + 8);
  this_01 = (ostringstream *)(local_6700 + 8);
  lVar13 = 0;
  uVar12 = 0;
  while( true ) {
    pTVar2 = (this->m_polys).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)(this->m_polys).
                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2;
    if ((ulong)(lVar11 / 0x60) <= uVar12) break;
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&v0Properties,(_anonymous_namespace_ *)((long)(pTVar2->p0).m_data + lVar13),
               (Vec4 *)(lVar11 % 0x60));
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&v1Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_polys).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar13),p);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&v2Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_polys).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->p2).m_data + lVar13),p_00);
    Functional::(anonymous_namespace)::genColorString_abi_cxx11_
              (&c0Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_polys).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->c0).m_data + lVar13),p_01);
    Functional::(anonymous_namespace)::genColorString_abi_cxx11_
              (&c1Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_polys).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->c1).m_data + lVar13),p_02);
    Functional::(anonymous_namespace)::genColorString_abi_cxx11_
              (&c2Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_polys).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->c2).m_data + lVar13),p_03);
    local_6700._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tv0 (x=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_polys).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar13));
    std::operator<<((ostream *)poVar1,"\ty=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_polys).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar13 + 4));
    std::operator<<((ostream *)poVar1,"\tz=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_polys).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar13 + 8));
    std::operator<<((ostream *)poVar1,"\tw=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_polys).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar13 + 0xc));
    std::operator<<((ostream *)poVar1,")\t");
    std::operator<<((ostream *)poVar1,(string *)&v0Properties);
    std::operator<<((ostream *)poVar1,"\t");
    std::operator<<((ostream *)poVar1,(string *)&c0Properties);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6700,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_6700._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"\tv1 (x=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar13));
    std::operator<<((ostream *)this_00,"\ty=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar13 + 4));
    std::operator<<((ostream *)this_00,"\tz=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar13 + 8));
    std::operator<<((ostream *)this_00,"\tw=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar13 + 0xc));
    std::operator<<((ostream *)this_00,")\t");
    std::operator<<((ostream *)this_00,(string *)&v1Properties);
    std::operator<<((ostream *)this_00,"\t");
    std::operator<<((ostream *)this_00,(string *)&c1Properties);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6700,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    local_6700._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"\tv2 (x=");
    std::ostream::operator<<
              (this_01,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                 lVar13));
    std::operator<<((ostream *)this_01,"\ty=");
    std::ostream::operator<<
              (this_01,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                 lVar13 + 4));
    std::operator<<((ostream *)this_01,"\tz=");
    std::ostream::operator<<
              (this_01,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                 lVar13 + 8));
    std::operator<<((ostream *)this_01,"\tw=");
    std::ostream::operator<<
              (this_01,*(float *)((long)(((this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                 lVar13 + 0xc));
    std::operator<<((ostream *)this_01,")\t");
    std::operator<<((ostream *)this_01,(string *)&v2Properties);
    std::operator<<((ostream *)this_01,"\t");
    std::operator<<((ostream *)this_01,(string *)&c2Properties);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6700,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    local_6700._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_6700 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6700,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_6700 + 8));
    std::__cxx11::string::~string((string *)&c2Properties);
    std::__cxx11::string::~string((string *)&c1Properties);
    std::__cxx11::string::~string((string *)&c0Properties);
    std::__cxx11::string::~string((string *)&v2Properties);
    std::__cxx11::string::~string((string *)&v1Properties);
    std::__cxx11::string::~string((string *)&v0Properties);
    uVar12 = uVar12 + 1;
    lVar13 = lVar13 + 0x60;
  }
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    pCVar3 = contexts[lVar13];
    pSVar4 = surfaces[lVar13];
    uVar5 = (*pCVar3->_vptr_Context[0x75])(pCVar3,&program);
    uVar6 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_position");
    uVar7 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_color");
    (*pCVar3->_vptr_Context[0x2a])(0,0,0,0x3f800000,pCVar3);
    (*pCVar3->_vptr_Context[0x2b])(0x3f800000,pCVar3);
    (*pCVar3->_vptr_Context[0x2d])(pCVar3,0x4100);
    (*pCVar3->_vptr_Context[5])
              (pCVar3,(ulong)(uint)(this->m_viewport).left,(ulong)(uint)*value,
               (ulong)(uint)*value_00,(ulong)(uint)*value_01);
    (*pCVar3->_vptr_Context[0x76])(pCVar3,(ulong)uVar5);
    (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar6);
    (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar7);
    (*pCVar3->_vptr_Context[0x4e])
              (pCVar3,(ulong)uVar6,4,0x1406,0,0x20,
               (this->m_polys).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (*pCVar3->_vptr_Context[0x4e])
              (pCVar3,(ulong)uVar7,4,0x1406,0,0x20,
               &((this->m_polys).
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->c0);
    (*pCVar3->_vptr_Context[0x68])
              (pCVar3,4,0,
               (ulong)(uint)((int)(((long)(this->m_polys).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_polys).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x60) * 3));
    (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar6);
    (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar7);
    (*pCVar3->_vptr_Context[0x76])(pCVar3,0);
    (*pCVar3->_vptr_Context[0x77])(pCVar3,(ulong)uVar5);
    (*pCVar3->_vptr_Context[0x7a])(pCVar3);
    (*pCVar3->_vptr_Context[0x80])(pCVar3,pSVar4,0,0,200,200);
  }
  tcu::Surface::getAccess((PixelBufferAccess *)local_6700,&testSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&v0Properties,&refSurface);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_6700,&v0Properties);
  tcu::Surface::~Surface(&refSurface);
  tcu::Surface::~Surface(&testSurface);
  sglr::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
  sglr::ReferenceContext::~ReferenceContext(&refContext);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6508);
  sglr::GLContext::~GLContext(&glesContext);
  return;
}

Assistant:

void TriangleCaseBase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);
	const int verticesPerTriangle	= 3;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering triangles. Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_polys.size(); ++ndx)
	{
		const std::string v0Properties = genClippingPointInfoString(m_polys[ndx].p0);
		const std::string v1Properties = genClippingPointInfoString(m_polys[ndx].p1);
		const std::string v2Properties = genClippingPointInfoString(m_polys[ndx].p2);
		const std::string c0Properties = genColorString(m_polys[ndx].c0);
		const std::string c1Properties = genColorString(m_polys[ndx].c1);
		const std::string c2Properties = genColorString(m_polys[ndx].c2);

		log << TestLog::Message << "\tv0 (x=" << m_polys[ndx].p0.x() << "\ty=" << m_polys[ndx].p0.y() << "\tz=" << m_polys[ndx].p0.z() << "\tw=" << m_polys[ndx].p0.w() << ")\t" << v0Properties << "\t" << c0Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv1 (x=" << m_polys[ndx].p1.x() << "\ty=" << m_polys[ndx].p1.y() << "\tz=" << m_polys[ndx].p1.z() << "\tw=" << m_polys[ndx].p1.w() << ")\t" << v1Properties << "\t" << c1Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv2 (x=" << m_polys[ndx].p2.x() << "\ty=" << m_polys[ndx].p2.y() << "\tz=" << m_polys[ndx].p2.z() << "\tw=" << m_polys[ndx].p2.w() << ")\t" << v2Properties << "\t" << c2Properties << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	// render test image
	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.enableVertexAttribArray		(colorLoc);
		ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_polys[0].p0);
		ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_polys[0].c0);
		ctx.drawArrays					(GL_TRIANGLES, 0, verticesPerTriangle * (glw::GLsizei)m_polys.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.disableVertexAttribArray	(colorLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	verifyImage(testSurface.getAccess(), refSurface.getAccess());
}